

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::cancelGesturesForChildren(QGraphicsScenePrivate *this,QGesture *original)

{
  bool bVar1;
  QGraphicsObject *pQVar2;
  QGraphicsObject **ppQVar3;
  QGesturePrivate *pQVar4;
  QGestureManager *pQVar5;
  QGraphicsItemPrivate *pQVar6;
  QApplicationPrivate *pQVar7;
  QGesture **__filename;
  long in_RDI;
  long in_FS_OFFSET;
  QGestureManager *gestureManager;
  QGraphicsItemPrivate *d;
  QGraphicsObject *object;
  QGraphicsItem **item_2;
  QList<QGraphicsItem_*> *__range4;
  QGesture *g;
  QList<QGesture_*> *__range3;
  QGraphicsObject *item_1;
  QGraphicsObject *target;
  QGraphicsObject *item;
  QGraphicsItem *originalItem;
  QGestureEvent ev_1;
  QList<QGesture_*> list_1;
  const_iterator __end4;
  const_iterator __begin4;
  QList<QGraphicsItem_*> items;
  const_iterator __end3;
  const_iterator __begin3;
  QGestureEvent ev;
  QList<QGesture_*> list;
  QSet<QGesture_*> gestures;
  Iterator setIter;
  QSet<QGesture_*> almostCanceledGestures;
  Iterator iter;
  QSet<QGesture_*> canceledGestures;
  QGestureManager *in_stack_fffffffffffffd58;
  QGestureEvent *in_stack_fffffffffffffd60;
  QGestureManager *in_stack_fffffffffffffd68;
  QGestureEvent *in_stack_fffffffffffffd70;
  QGraphicsItem *in_stack_fffffffffffffd78;
  QGraphicsObject *in_stack_fffffffffffffd80;
  QGraphicsScenePrivate *this_00;
  QWidget *in_stack_fffffffffffffda0;
  QWidget *pQVar8;
  QPointF *in_stack_fffffffffffffda8;
  QWidget *in_stack_fffffffffffffdb0;
  QGraphicsScenePrivate *in_stack_fffffffffffffdb8;
  QGraphicsScenePrivate *local_230;
  int local_21c;
  QGraphicsObject *local_1e0;
  iterator local_1b0;
  QEvent local_1a0 [64];
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  GestureType local_144;
  QGraphicsItem **local_140;
  const_iterator local_138;
  const_iterator local_130 [2];
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  QGesture **local_108;
  const_iterator local_100;
  const_iterator local_f8;
  QEvent local_f0 [64];
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  iterator local_88 [2];
  iterator local_68;
  undefined1 *local_58;
  iterator local_50;
  undefined1 *local_40;
  piter local_38;
  piter local_28;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QHash<QGesture_*,_QGraphicsObject_*>::value
                     ((QHash<QGesture_*,_QGraphicsObject_*> *)in_stack_fffffffffffffd68,
                      (QGesture **)in_stack_fffffffffffffd60);
  local_230 = (QGraphicsScenePrivate *)0x0;
  if (pQVar2 != (QGraphicsObject *)0x0) {
    local_230 = (QGraphicsScenePrivate *)&pQVar2->super_QGraphicsItem;
  }
  if (local_230 != (QGraphicsScenePrivate *)0x0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QSet<QGesture_*>::QSet((QSet<QGesture_*> *)0x9dac19);
    local_28.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d = (Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = (piter)QHash<QGesture_*,_QGraphicsObject_*>::begin
                                ((QHash<QGesture_*,_QGraphicsObject_*> *)in_stack_fffffffffffffd78);
    while( true ) {
      local_38 = (piter)QHash<QGesture_*,_QGraphicsObject_*>::end
                                  ((QHash<QGesture_*,_QGraphicsObject_*> *)in_stack_fffffffffffffd68
                                  );
      bVar1 = QHash<QGesture_*,_QGraphicsObject_*>::iterator::operator!=
                        ((iterator *)in_stack_fffffffffffffd68,(iterator *)in_stack_fffffffffffffd60
                        );
      if (!bVar1) break;
      ppQVar3 = QHash<QGesture_*,_QGraphicsObject_*>::iterator::value((iterator *)0x9daca4);
      pQVar8 = (QWidget *)*ppQVar3;
      in_stack_fffffffffffffdb8 = (QGraphicsScenePrivate *)0x0;
      if (pQVar8 != (QWidget *)0x0) {
        in_stack_fffffffffffffdb8 = (QGraphicsScenePrivate *)&pQVar8->super_QPaintDevice;
      }
      in_stack_fffffffffffffdb0 = pQVar8;
      if (in_stack_fffffffffffffdb8 != local_230) {
        in_stack_fffffffffffffda8 = (QPointF *)0x0;
        if (pQVar8 != (QWidget *)0x0) {
          in_stack_fffffffffffffda8 = (QPointF *)&pQVar8->super_QPaintDevice;
        }
        bVar1 = QGraphicsItem::isAncestorOf
                          (in_stack_fffffffffffffd78,(QGraphicsItem *)in_stack_fffffffffffffd70);
        in_stack_fffffffffffffda0 = pQVar8;
        if (bVar1) {
          QHash<QGesture_*,_QGraphicsObject_*>::iterator::key((iterator *)0x9dad41);
          pQVar4 = QGesture::d_func((QGesture *)0x9dad49);
          pQVar4->state = GestureCanceled;
          QHash<QGesture_*,_QGraphicsObject_*>::iterator::key((iterator *)0x9dad5d);
          QSet<QGesture_*>::operator<<
                    ((QSet<QGesture_*> *)in_stack_fffffffffffffd68,
                     (QGesture **)in_stack_fffffffffffffd60);
          in_stack_fffffffffffffda0 = pQVar8;
        }
      }
      QHash<QGesture_*,_QGraphicsObject_*>::iterator::operator++
                ((iterator *)in_stack_fffffffffffffd70);
    }
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QSet<QGesture_*>::QSet
              ((QSet<QGesture_*> *)in_stack_fffffffffffffd60,
               (QSet<QGesture_*> *)in_stack_fffffffffffffd58);
    local_50.i.i.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)&DAT_aaaaaaaaaaaaaaaa
    ;
    local_50.i.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    QSet<QGesture_*>::iterator::iterator((iterator *)0x9dadce);
    while (bVar1 = QSet<QGesture_*>::isEmpty((QSet<QGesture_*> *)0x9daddb),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      local_1e0 = (QGraphicsObject *)0x0;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QSet<QGesture_*>::QSet((QSet<QGesture_*> *)0x9dae0e);
      QSet<QGesture_*>::begin((QSet<QGesture_*> *)in_stack_fffffffffffffd78);
      QSet<QGesture_*>::iterator::operator=(&local_50,&local_68);
      while( true ) {
        QSet<QGesture_*>::end((QSet<QGesture_*> *)in_stack_fffffffffffffd78);
        bVar1 = QSet<QGesture_*>::iterator::operator!=
                          ((iterator *)in_stack_fffffffffffffd60,
                           (iterator *)in_stack_fffffffffffffd58);
        if (!bVar1) break;
        QSet<QGesture_*>::iterator::operator*((iterator *)0x9dae88);
        pQVar2 = QHash<QGesture_*,_QGraphicsObject_*>::value
                           ((QHash<QGesture_*,_QGraphicsObject_*> *)in_stack_fffffffffffffd68,
                            (QGesture **)in_stack_fffffffffffffd60);
        if (local_1e0 == (QGraphicsObject *)0x0) {
          local_1e0 = pQVar2;
        }
        if (local_1e0 == pQVar2) {
          QSet<QGesture_*>::iterator::operator*((iterator *)0x9daed7);
          QSet<QGesture_*>::operator<<
                    ((QSet<QGesture_*> *)in_stack_fffffffffffffd68,
                     (QGesture **)in_stack_fffffffffffffd60);
          QSet<QGesture_*>::const_iterator::const_iterator
                    ((const_iterator *)in_stack_fffffffffffffd60,
                     (iterator *)in_stack_fffffffffffffd58);
          QSet<QGesture_*>::erase
                    ((QSet<QGesture_*> *)in_stack_fffffffffffffd80,
                     (const_iterator *)in_stack_fffffffffffffd78);
          QSet<QGesture_*>::iterator::operator=(&local_50,local_88);
        }
        else {
          QSet<QGesture_*>::iterator::operator++((iterator *)in_stack_fffffffffffffd60);
        }
      }
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_a0 = &DAT_aaaaaaaaaaaaaaaa;
      QSet<QGesture_*>::values((QSet<QGesture_*> *)in_stack_fffffffffffffd70);
      memset(local_f0,0xaa,0x40);
      QGestureEvent::QGestureEvent
                (in_stack_fffffffffffffd60,(QList<QGesture_*> *)in_stack_fffffffffffffd58);
      this_00 = (QGraphicsScenePrivate *)0x0;
      if (local_1e0 != (QGraphicsObject *)0x0) {
        this_00 = (QGraphicsScenePrivate *)&local_1e0->super_QGraphicsItem;
      }
      sendEvent(this_00,(QGraphicsItem *)local_1e0,(QEvent *)in_stack_fffffffffffffd78);
      bVar1 = QEvent::isAccepted(local_f0);
      if (!bVar1) {
        local_f8.i = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
        local_f8 = QList<QGesture_*>::begin((QList<QGesture_*> *)in_stack_fffffffffffffd60);
        local_100.i = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
        local_100 = QList<QGesture_*>::end((QList<QGesture_*> *)in_stack_fffffffffffffd60);
        while( true ) {
          local_108 = local_100.i;
          bVar1 = QList<QGesture_*>::const_iterator::operator!=(&local_f8,local_100);
          if (!bVar1) break;
          QList<QGesture_*>::const_iterator::operator*(&local_f8);
          bVar1 = QGestureEvent::isAccepted
                            (in_stack_fffffffffffffd70,(QGesture *)in_stack_fffffffffffffd68);
          if ((!bVar1) && (bVar1 = QGesture::hasHotSpot((QGesture *)0x9db0e1), bVar1)) {
            local_120 = &DAT_aaaaaaaaaaaaaaaa;
            local_118 = &DAT_aaaaaaaaaaaaaaaa;
            local_110 = &DAT_aaaaaaaaaaaaaaaa;
            QPoint::QPoint((QPoint *)in_stack_fffffffffffffd60);
            QGesture::d_func((QGesture *)0x9db131);
            itemsAtPosition(in_stack_fffffffffffffdb8,(QPoint *)in_stack_fffffffffffffdb0,
                            in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
            local_130[0].i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
            local_130[0] = QList<QGraphicsItem_*>::begin
                                     ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffd60);
            local_138.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
            local_138 = QList<QGraphicsItem_*>::end
                                  ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffd60);
            while( true ) {
              local_140 = local_138.i;
              bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(local_130,local_138);
              if (!bVar1) break;
              QList<QGraphicsItem_*>::const_iterator::operator*(local_130);
              pQVar5 = (QGestureManager *)
                       QGraphicsItem::toGraphicsObject((QGraphicsItem *)in_stack_fffffffffffffd60);
              if (pQVar5 != (QGestureManager *)0x0) {
                pQVar6 = QGraphicsItem::d_func((QGraphicsItem *)0x9db252);
                in_stack_fffffffffffffd78 = (QGraphicsItem *)&pQVar6->gestureContext;
                local_144 = QGesture::gestureType((QGesture *)0x9db27a);
                bVar1 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::contains
                                  ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                                   in_stack_fffffffffffffd70,
                                   (GestureType *)in_stack_fffffffffffffd68);
                if (bVar1) {
                  local_160 = &DAT_aaaaaaaaaaaaaaaa;
                  local_158 = &DAT_aaaaaaaaaaaaaaaa;
                  local_150 = &DAT_aaaaaaaaaaaaaaaa;
                  QList<QGesture_*>::QList((QList<QGesture_*> *)0x9db2d6);
                  QList<QGesture_*>::operator<<
                            ((QList<QGesture_*> *)in_stack_fffffffffffffd60,
                             (parameter_type)in_stack_fffffffffffffd58);
                  memset(local_1a0,0xaa,0x40);
                  QGestureEvent::QGestureEvent
                            (in_stack_fffffffffffffd60,
                             (QList<QGesture_*> *)in_stack_fffffffffffffd58);
                  in_stack_fffffffffffffd70 = (QGestureEvent *)0x0;
                  if (pQVar5 != (QGestureManager *)0x0) {
                    in_stack_fffffffffffffd70 = (QGestureEvent *)&pQVar5->m_recognizers;
                  }
                  sendEvent(this_00,(QGraphicsItem *)local_1e0,(QEvent *)in_stack_fffffffffffffd78);
                  bVar1 = QEvent::isAccepted(local_1a0);
                  if ((bVar1) ||
                     (bVar1 = QGestureEvent::isAccepted
                                        (in_stack_fffffffffffffd70,(QGesture *)pQVar5), bVar1)) {
                    local_21c = 10;
                    in_stack_fffffffffffffd68 = pQVar5;
                  }
                  else {
                    local_21c = 0;
                    in_stack_fffffffffffffd68 = pQVar5;
                  }
                  QGestureEvent::~QGestureEvent(in_stack_fffffffffffffd60);
                  QList<QGesture_*>::~QList((QList<QGesture_*> *)0x9db3b4);
                  if (local_21c != 0) break;
                }
              }
              QList<QGraphicsItem_*>::const_iterator::operator++(local_130);
            }
            QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9db3e6);
          }
          QList<QGesture_*>::const_iterator::operator++(&local_f8);
        }
      }
      QGestureEvent::~QGestureEvent(in_stack_fffffffffffffd60);
      QList<QGesture_*>::~QList((QList<QGesture_*> *)0x9db414);
      QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9db421);
      in_stack_fffffffffffffd80 = local_1e0;
    }
    pQVar7 = QApplicationPrivate::instance();
    pQVar5 = pQVar7->gestureManager;
    QSet<QGesture_*>::begin((QSet<QGesture_*> *)in_stack_fffffffffffffd78);
    QSet<QGesture_*>::iterator::operator=(&local_50,&local_1b0);
    while( true ) {
      QSet<QGesture_*>::end((QSet<QGesture_*> *)in_stack_fffffffffffffd78);
      bVar1 = QSet<QGesture_*>::iterator::operator!=
                        ((iterator *)in_stack_fffffffffffffd60,(iterator *)in_stack_fffffffffffffd58
                        );
      if (!bVar1) break;
      in_stack_fffffffffffffd58 = pQVar5;
      QSet<QGesture_*>::iterator::operator*((iterator *)0x9db4ad);
      QGestureManager::recycle(in_stack_fffffffffffffd68,(QGesture *)in_stack_fffffffffffffd78);
      in_stack_fffffffffffffd60 = (QGestureEvent *)(in_RDI + 0x360);
      __filename = QSet<QGesture_*>::iterator::operator*((iterator *)0x9db4d6);
      QHash<QGesture_*,_QGraphicsObject_*>::remove
                ((QHash<QGesture_*,_QGraphicsObject_*> *)in_stack_fffffffffffffd60,
                 (char *)__filename);
      QSet<QGesture_*>::iterator::operator++((iterator *)in_stack_fffffffffffffd60);
    }
    QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9db502);
    QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9db50f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::cancelGesturesForChildren(QGesture *original)
{
    Q_ASSERT(original);
    QGraphicsItem *originalItem = gestureTargets.value(original);
    if (originalItem == nullptr) // we only act on accepted gestures, which implies it has a target.
        return;

    // iterate over all active gestures and for each find the owner
    // if the owner is part of our sub-hierarchy, cancel it.

    QSet<QGesture *> canceledGestures;
    QHash<QGesture *, QGraphicsObject *>::Iterator iter = gestureTargets.begin();
    while (iter != gestureTargets.end()) {
        QGraphicsObject *item = iter.value();
        // note that we don't touch the gestures for our originalItem
        if (item != originalItem && originalItem->isAncestorOf(item)) {
            DEBUG() << "  found a gesture to cancel" << iter.key();
            iter.key()->d_func()->state = Qt::GestureCanceled;
            canceledGestures << iter.key();
        }
        ++iter;
    }

    // sort them per target item by cherry picking from almostCanceledGestures and delivering
    QSet<QGesture *> almostCanceledGestures = canceledGestures;
    QSet<QGesture *>::Iterator setIter;
    while (!almostCanceledGestures.isEmpty()) {
        QGraphicsObject *target = nullptr;
        QSet<QGesture*> gestures;
        setIter = almostCanceledGestures.begin();
        // sort per target item
        while (setIter != almostCanceledGestures.end()) {
            QGraphicsObject *item = gestureTargets.value(*setIter);
            if (target == nullptr)
                target = item;
            if (target == item) {
                gestures << *setIter;
                setIter = almostCanceledGestures.erase(setIter);
            } else {
                ++setIter;
            }
        }
        Q_ASSERT(target);

        const QList<QGesture *> list = gestures.values();
        QGestureEvent ev(list);
        sendEvent(target, &ev);

        if (!ev.isAccepted()) {
            for (QGesture *g : list) {

                if (ev.isAccepted(g))
                    continue;

                if (!g->hasHotSpot())
                    continue;

                const QList<QGraphicsItem *> items = itemsAtPosition(QPoint(), g->d_func()->sceneHotSpot, nullptr);
                for (const auto &item : items) {
                    QGraphicsObject *object = item->toGraphicsObject();
                    if (!object)
                        continue;
                    QGraphicsItemPrivate *d = object->QGraphicsItem::d_func();
                    if (d->gestureContext.contains(g->gestureType())) {
                        QList<QGesture *> list;
                        list << g;
                        QGestureEvent ev(list);
                        sendEvent(object, &ev);
                        if (ev.isAccepted() || ev.isAccepted(g))
                            break; // successfully delivered
                    }
                }
            }
        }
    }

    QGestureManager *gestureManager = QApplicationPrivate::instance()->gestureManager;
    Q_ASSERT(gestureManager); // it would be very odd if we got called without a manager.
    for (setIter = canceledGestures.begin(); setIter != canceledGestures.end(); ++setIter) {
        gestureManager->recycle(*setIter);
        gestureTargets.remove(*setIter);
    }
}